

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-grammar.cpp
# Opt level: O0

bool __thiscall llama_grammar_parser::parse(llama_grammar_parser *this,char *src)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  runtime_error *prVar3;
  char *in_RSI;
  long in_RDI;
  char *in_stack_00000028;
  llama_grammar_parser *in_stack_00000030;
  exception *err;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *kv;
  iterator __end5;
  iterator __begin5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *__range5;
  llama_grammar_element *elem;
  const_iterator __end2;
  const_iterator __begin2;
  vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *__range2;
  vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *rule;
  iterator __end1;
  iterator __begin1;
  llama_grammar_rules *__range1;
  char *pos;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *in_stack_fffffffffffffee8;
  __normal_iterator<const_llama_grammar_element_*,_std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>
  *in_stack_fffffffffffffef0;
  vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  string local_b0 [32];
  reference local_90;
  _Self local_88;
  _Self local_80 [2];
  reference local_70;
  llama_grammar_element *local_68;
  __normal_iterator<const_llama_grammar_element_*,_std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>
  local_60;
  reference local_58;
  reference local_50;
  vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *local_48;
  __normal_iterator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_*,_std::vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>_>
  local_40;
  long local_38;
  char *local_20;
  
  local_20 = parse_space(in_RSI,true);
  while (*local_20 != '\0') {
    local_20 = parse_rule(in_stack_00000030,in_stack_00000028);
  }
  local_38 = in_RDI + 0x30;
  local_40._M_current =
       (vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)
       std::
       vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
       ::begin((vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
                *)in_stack_fffffffffffffee8);
  local_48 = (vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)
             std::
             vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
             ::end((vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
                    *)in_stack_fffffffffffffee8);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_*,_std::vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>_>
                        *)in_stack_fffffffffffffef0,
                       (__normal_iterator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_*,_std::vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>_>
                        *)in_stack_fffffffffffffee8);
    if (!bVar1) {
      return true;
    }
    local_50 = __gnu_cxx::
               __normal_iterator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_*,_std::vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>_>
               ::operator*(&local_40);
    bVar1 = std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::empty
                      (in_stack_ffffffffffffff00);
    if (bVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Undefined rule");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_58 = local_50;
    local_60._M_current =
         (llama_grammar_element *)
         std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::begin
                   ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)
                    in_stack_fffffffffffffee8);
    local_68 = (llama_grammar_element *)
               std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::end
                         ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)
                          in_stack_fffffffffffffee8);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_fffffffffffffef0,
                              (__normal_iterator<const_llama_grammar_element_*,_std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>
                               *)in_stack_fffffffffffffee8), bVar1) {
      local_70 = __gnu_cxx::
                 __normal_iterator<const_llama_grammar_element_*,_std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>
                 ::operator*(&local_60);
      if (local_70->type == LLAMA_GRETYPE_RULE_REF) {
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (ulong)local_70->value;
        pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
                 ::size((vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
                         *)(in_RDI + 0x30));
        if (__lhs < pbVar2) {
          std::
          vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
          ::operator[]((vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
                        *)(in_RDI + 0x30),(ulong)local_70->value);
          bVar1 = std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::empty
                            (in_stack_ffffffffffffff00);
          if (!bVar1) goto LAB_003f0df2;
        }
        local_80[0]._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::begin(in_stack_fffffffffffffee8);
        local_88._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::end(in_stack_fffffffffffffee8);
        while (bVar1 = std::operator!=(local_80,&local_88), bVar1) {
          local_90 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                     ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                                  *)0x3f0c53);
          if (local_90->second == local_70->value) {
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
            std::operator+(__lhs,(char *)prVar3);
            std::runtime_error::runtime_error(prVar3,local_b0);
            __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
          ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                        *)in_stack_fffffffffffffef0);
        }
      }
LAB_003f0df2:
      __gnu_cxx::
      __normal_iterator<const_llama_grammar_element_*,_std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>
      ::operator++(&local_60);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_*,_std::vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>_>
    ::operator++(&local_40);
  } while( true );
}

Assistant:

bool llama_grammar_parser::parse(const char * src) {
    try {
        const char * pos = parse_space(src, true);
        while (*pos) {
            pos = parse_rule(pos);
        }
        // Validate the state to ensure that all rules are defined
        for (const auto & rule : rules) {
            if (rule.empty()) {
                throw std::runtime_error("Undefined rule");
            }
            for (const auto & elem : rule) {
                if (elem.type == LLAMA_GRETYPE_RULE_REF) {
                    // Ensure that the rule at that location exists
                    if (elem.value >= rules.size() || rules[elem.value].empty()) {
                        // Get the name of the rule that is missing
                        for (const auto & kv : symbol_ids) {
                            if (kv.second == elem.value) {
                                throw std::runtime_error("Undefined rule identifier '" + kv.first + "'");
                            }
                        }
                    }
                }
            }
        }
    } catch (const std::exception & err) {
        fprintf(stderr, "%s: error parsing grammar: %s\n\n%s\n", __func__, err.what(), src);
        rules.clear();
        return false;
    }

    return true;
}